

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O0

void __thiscall Assimp::LWOImporter::ResolveTags(LWOImporter *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  int iVar1;
  size_type sVar2;
  reference a_00;
  reference b;
  reference pvVar3;
  ulong uVar4;
  string *d;
  uint i;
  string *c;
  uint a;
  LWOImporter *this_local;
  
  this_00 = this->mMapping;
  _a = this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(this->mTags);
  c._4_4_ = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (this_00,sVar2,(value_type_conflict *)((long)&c + 4));
  c._0_4_ = 0;
  do {
    uVar4 = (ulong)(uint)c;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(this->mTags);
    if (sVar2 <= uVar4) {
      return;
    }
    a_00 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](this->mTags,(ulong)(uint)c);
    d._4_4_ = 0;
    while( true ) {
      sVar2 = std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::size
                        (this->mSurfaces);
      if (sVar2 <= d._4_4_) break;
      b = std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::operator[]
                    (this->mSurfaces,(ulong)d._4_4_);
      iVar1 = ASSIMP_stricmp(a_00,&b->mName);
      if (iVar1 == 0) {
        pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (this->mMapping,(ulong)(uint)c);
        *pvVar3 = d._4_4_;
        break;
      }
      d._4_4_ = d._4_4_ + 1;
    }
    c._0_4_ = (uint)c + 1;
  } while( true );
}

Assistant:

void LWOImporter::ResolveTags()
{
    // --- this function is used for both LWO2 and LWOB
    mMapping->resize(mTags->size(), UINT_MAX);
    for (unsigned int a = 0; a  < mTags->size();++a)    {

        const std::string& c = (*mTags)[a];
        for (unsigned int i = 0; i < mSurfaces->size();++i) {

            const std::string& d = (*mSurfaces)[i].mName;
            if (!ASSIMP_stricmp(c,d))   {

                (*mMapping)[a] = i;
                break;
            }
        }
    }
}